

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_helpers.cc
# Opt level: O0

string * google::protobuf::compiler::csharp::StringToBase64
                   (string *__return_storage_ptr__,string *input)

{
  byte *local_30;
  uchar *src;
  size_t remaining;
  string *input_local;
  string *result;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  src = (uchar *)std::__cxx11::string::size();
  local_30 = (byte *)std::__cxx11::string::c_str();
  for (; (uchar *)0x2 < src; src = src + -3) {
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,
               "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[*local_30 >> 2]);
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,
               "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
               [(*local_30 & 3) << 4 | (uint)(local_30[1] >> 4)]);
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,
               "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
               [(uint)(local_30[2] >> 6) + (local_30[1] & 0xf) * 4]);
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,
               "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
               [local_30[2] & 0x3f]);
    local_30 = local_30 + 3;
  }
  if (src == (uchar *)0x1) {
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,
               "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[*local_30 >> 2]);
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,
               "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
               [(*local_30 & 3) << 4]);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'=');
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'=');
  }
  else if (src == (uchar *)0x2) {
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,
               "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[*local_30 >> 2]);
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,
               "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
               [(*local_30 & 3) << 4 | (uint)(local_30[1] >> 4)]);
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,
               "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
               [(ulong)(local_30[1] & 0xf) * 4]);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'=');
  }
  return __return_storage_ptr__;
}

Assistant:

std::string StringToBase64(const std::string& input) {
  std::string result;
  size_t remaining = input.size();
  const unsigned char *src = (const unsigned char*) input.c_str();
  while (remaining > 2) {
    result += base64_chars[src[0] >> 2];
    result += base64_chars[((src[0] & 0x3) << 4) | (src[1] >> 4)];
    result += base64_chars[((src[1] & 0xf) << 2) | (src[2] >> 6)];
    result += base64_chars[src[2] & 0x3f];
    remaining -= 3;
    src += 3;
  }
  switch (remaining) {
    case 2:
      result += base64_chars[src[0] >> 2];
      result += base64_chars[((src[0] & 0x3) << 4) | (src[1] >> 4)];
      result += base64_chars[(src[1] & 0xf) << 2];
      result += '=';
      src += 2;
      break;
    case 1:
      result += base64_chars[src[0] >> 2];
      result += base64_chars[((src[0] & 0x3) << 4)];
      result += '=';
      result += '=';
      src += 1;
      break;
  }
  return result;
}